

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_opcode_ds(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  size_t in_RDX;
  char *pcVar3;
  undefined8 uStack_c0;
  char local_b8 [8];
  char dst [64];
  char src0 [64];
  
  uStack_c0 = 0x1185a3;
  make_D3D_destarg_string(ctx,local_b8,in_RDX);
  uStack_c0 = 0x1185bc;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,dst + 0x38,0x40);
  uStack_c0 = 0x1185c4;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1185e0;
  lowercase(local_b8 + lVar1,opcode);
  pcVar3 = "+";
  if (ctx->coissue == 0) {
    pcVar3 = "";
  }
  *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x118614;
  output_line(ctx,"%s%s%s, %s",pcVar3,local_b8 + lVar1,local_b8,dst + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_ds(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s", ctx->coissue ? "+" : "", opcode, dst, src0);
}